

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_si_iec_units.cpp
# Opt level: O2

bool tlx::parse_si_iec_units(char *str,uint64_t *out_size,char default_unit)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  bool bVar8;
  char *local_20;
  
  uVar3 = strtoul(str,&local_20,10);
  *out_size = uVar3;
  if (local_20 == (char *)0x0) {
    return false;
  }
  for (pbVar7 = (byte *)(local_20 + 2); bVar2 = pbVar7[-2], bVar2 == 0x20; pbVar7 = pbVar7 + 1) {
  }
  switch(bVar2) {
  case 0x4b:
switchD_0014ec0c_caseD_6b:
    iVar4 = 1;
    break;
  case 0x4c:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x52:
  case 0x53:
switchD_0014ec0c_caseD_6c:
    pbVar7 = pbVar7 + -2;
    uVar5 = 1000;
    bVar8 = true;
    iVar4 = 0;
    goto LAB_0014ec87;
  case 0x4d:
switchD_0014ec0c_caseD_6d:
    iVar4 = 2;
    break;
  case 0x50:
switchD_0014ec0c_caseD_70:
    iVar4 = 5;
    break;
  case 0x54:
switchD_0014ec0c_caseD_74:
    iVar4 = 4;
    break;
  default:
    switch(bVar2) {
    case 0x6b:
      goto switchD_0014ec0c_caseD_6b;
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x73:
      goto switchD_0014ec0c_caseD_6c;
    case 0x6d:
      goto switchD_0014ec0c_caseD_6d;
    case 0x70:
      goto switchD_0014ec0c_caseD_70;
    case 0x74:
      goto switchD_0014ec0c_caseD_74;
    default:
      if ((bVar2 != 0x47) && (bVar2 != 0x67)) goto switchD_0014ec0c_caseD_6c;
      iVar4 = 3;
    }
  }
  bVar2 = pbVar7[-1];
  if ((bVar2 | 0x20) == 0x69) {
    bVar2 = *pbVar7;
    uVar5 = 0x400;
    bVar8 = false;
  }
  else {
    uVar5 = 1000;
    bVar8 = false;
    pbVar7 = pbVar7 + -1;
  }
LAB_0014ec87:
  if ((bVar2 | 0x20) == 0x62) {
    pbVar7 = pbVar7 + 1;
    goto LAB_0014ec9b;
  }
  if (!bVar8) goto LAB_0014ec9b;
  iVar6 = (int)default_unit;
  switch(iVar6) {
  case 0x4b:
    iVar4 = 1;
    break;
  case 0x4c:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x52:
  case 0x53:
    goto switchD_0014ecf3_caseD_6c;
  case 0x4d:
    iVar4 = 2;
    break;
  case 0x50:
    iVar4 = 5;
    break;
  case 0x54:
    iVar4 = 4;
    break;
  default:
    switch(iVar6) {
    case 0x6b:
      iVar4 = 1;
      break;
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x73:
      goto switchD_0014ecf3_caseD_6c;
    case 0x6d:
      iVar4 = 2;
      break;
    case 0x70:
      iVar4 = 5;
      break;
    case 0x74:
      iVar4 = 4;
      break;
    default:
      iVar4 = 3;
      if (iVar6 == 0x47) goto LAB_0014ed44;
      if (iVar6 == 0x67) break;
      goto switchD_0014ecf3_caseD_6c;
    }
    uVar5 = 1000;
    goto LAB_0014ec9b;
  }
LAB_0014ed44:
  uVar5 = 0x400;
LAB_0014ec9b:
  pbVar7 = pbVar7 + -1;
  do {
    pbVar1 = pbVar7 + 1;
    pbVar7 = pbVar7 + 1;
  } while (*pbVar1 == 0x20);
  while (bVar8 = iVar4 != 0, iVar4 = iVar4 + -1, bVar8) {
    uVar3 = uVar3 * uVar5;
    *out_size = uVar3;
  }
  return *pbVar7 == 0;
switchD_0014ecf3_caseD_6c:
  iVar4 = 0;
  goto LAB_0014ec9b;
}

Assistant:

bool parse_si_iec_units(
    const char* str, uint64_t* out_size, char default_unit) {

    char* endptr;
    *out_size = strtoul(str, &endptr, 10);
    if (endptr == nullptr) return false;        // parse failed, no number

    while (*endptr == ' ') ++endptr;            // skip over spaces

    // multiply with base ^ power
    unsigned int base = 1000;
    unsigned int power = 0;

    if (*endptr == 'k' || *endptr == 'K')
        power = 1, ++endptr;
    else if (*endptr == 'm' || *endptr == 'M')
        power = 2, ++endptr;
    else if (*endptr == 'g' || *endptr == 'G')
        power = 3, ++endptr;
    else if (*endptr == 't' || *endptr == 'T')
        power = 4, ++endptr;
    else if (*endptr == 'p' || *endptr == 'P')
        power = 5, ++endptr;

    // switch to power of two (only if power was set above)
    if ((*endptr == 'i' || *endptr == 'I') && power != 0)
        base = 1024, ++endptr;

    // byte indicator
    if (*endptr == 'b' || *endptr == 'B') {
        ++endptr;
    }
    else if (power == 0)
    {
        // no explicit power indicator, and no 'b' or 'B' -> apply default unit
        switch (default_unit)
        {
        default: break;
        case 'k': power = 1, base = 1000;
            break;
        case 'm': power = 2, base = 1000;
            break;
        case 'g': power = 3, base = 1000;
            break;
        case 't': power = 4, base = 1000;
            break;
        case 'p': power = 5, base = 1000;
            break;
        case 'K': power = 1, base = 1024;
            break;
        case 'M': power = 2, base = 1024;
            break;
        case 'G': power = 3, base = 1024;
            break;
        case 'T': power = 4, base = 1024;
            break;
        case 'P': power = 5, base = 1024;
            break;
        }
    }

    // skip over spaces
    while (*endptr == ' ') ++endptr;

    // multiply size
    for (unsigned int p = 0; p < power; ++p)
        *out_size *= base;

    return (*endptr == 0);
}